

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::Exception::Exception(Exception *this,Exception *other)

{
  char *pcVar1;
  char *pcVar2;
  RefOrVoid<const_kj::Exception::Context> orig;
  Own<kj::Exception::Context> local_58;
  Maybe<kj::Own<kj::Exception::Context>_> local_48;
  Own<kj::Exception::Context> *local_38;
  Own<kj::Exception::Context> *c;
  Exception *local_18;
  Exception *other_local;
  Exception *this_local;
  
  local_18 = other;
  other_local = this;
  String::String(&this->ownFile);
  this->file = local_18->file;
  this->line = local_18->line;
  this->type = local_18->type;
  heapString(&this->description,&local_18->description);
  Maybe<kj::Own<kj::Exception::Context>_>::Maybe(&this->context);
  this->traceCount = local_18->traceCount;
  pcVar2 = this->file;
  pcVar1 = String::cStr(&local_18->ownFile);
  if (pcVar2 == pcVar1) {
    heapString((String *)&c,&local_18->ownFile);
    String::operator=(&this->ownFile,(String *)&c);
    String::~String((String *)&c);
    pcVar2 = String::cStr(&this->ownFile);
    this->file = pcVar2;
  }
  memcpy(this->trace,local_18->trace,(ulong)this->traceCount << 3);
  local_38 = _::readMaybe<kj::Exception::Context>(&local_18->context);
  if (local_38 != (Own<kj::Exception::Context> *)0x0) {
    orig = Own<kj::Exception::Context>::operator*(local_38);
    heap<kj::Exception::Context_const&>((kj *)&local_58,orig);
    Maybe<kj::Own<kj::Exception::Context>_>::Maybe(&local_48,&local_58);
    Maybe<kj::Own<kj::Exception::Context>_>::operator=(&this->context,&local_48);
    Maybe<kj::Own<kj::Exception::Context>_>::~Maybe(&local_48);
    Own<kj::Exception::Context>::~Own(&local_58);
  }
  return;
}

Assistant:

Exception::Exception(const Exception& other) noexcept
    : file(other.file), line(other.line), type(other.type),
      description(heapString(other.description)), traceCount(other.traceCount) {
  if (file == other.ownFile.cStr()) {
    ownFile = heapString(other.ownFile);
    file = ownFile.cStr();
  }

  memcpy(trace, other.trace, sizeof(trace[0]) * traceCount);

  KJ_IF_MAYBE(c, other.context) {
    context = heap(**c);
  }
}